

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmcmd.cxx
# Opt level: O3

bool __thiscall cmVSLink::Parse(cmVSLink *this,const_iterator argBeg,const_iterator argEnd)

{
  string *__rhs;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *__s1;
  pointer pcVar2;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *this_00;
  int iVar3;
  ostream *poVar4;
  bool bVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string intDir;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  undefined1 *local_60;
  long local_58;
  undefined1 local_50;
  undefined7 uStack_4f;
  string *local_40;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_38;
  
  local_60 = &local_50;
  local_58 = 0;
  local_50 = 0;
  if (argBeg._M_current != argEnd._M_current) {
    do {
      if (*((argBeg._M_current)->_M_dataplus)._M_p != '-') break;
      iVar3 = std::__cxx11::string::compare((char *)argBeg._M_current);
      if (iVar3 == 0) {
        argBeg._M_current = argBeg._M_current + 1;
        break;
      }
      iVar3 = std::__cxx11::string::compare((char *)argBeg._M_current);
      if (iVar3 == 0) {
        while ((argBeg._M_current = argBeg._M_current + 1, argBeg._M_current != argEnd._M_current &&
               (*((argBeg._M_current)->_M_dataplus)._M_p != '-'))) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&this->UserManifests,argBeg._M_current);
        }
      }
      else {
        iVar3 = strncmp(((argBeg._M_current)->_M_dataplus)._M_p,"--intdir=",9);
        if (iVar3 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"unknown argument \'",0x12);
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,((argBeg._M_current)->_M_dataplus)._M_p,
                              (argBeg._M_current)->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\'\n",2);
          goto LAB_00227ec5;
        }
        std::__cxx11::string::substr((ulong)&local_80,(ulong)argBeg._M_current);
        std::__cxx11::string::operator=((string *)&local_60,(string *)&local_80);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
        argBeg._M_current = argBeg._M_current + 1;
      }
    } while (argBeg._M_current != argEnd._M_current);
  }
  bVar5 = false;
  if ((local_58 != 0) && (bVar5 = false, argBeg._M_current != argEnd._M_current)) {
    local_38 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &this->LinkCommand;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              (local_38,(this->LinkCommand).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,argBeg._M_current,
               argEnd._M_current);
    local_40 = (string *)&this->TargetFile;
    do {
      iVar3 = cmsys::SystemTools::Strucmp
                        (((argBeg._M_current)->_M_dataplus)._M_p,"/INCREMENTAL:YES");
      if ((iVar3 == 0) ||
         (iVar3 = cmsys::SystemTools::Strucmp
                            (((argBeg._M_current)->_M_dataplus)._M_p,"/INCREMENTAL"), iVar3 == 0)) {
        this->Incremental = true;
      }
      else {
        iVar3 = cmsys::SystemTools::Strucmp(((argBeg._M_current)->_M_dataplus)._M_p,"/MANIFEST:NO");
        if (iVar3 == 0) {
          this->LinkGeneratesManifest = false;
        }
        else {
          __s1 = ((argBeg._M_current)->_M_dataplus)._M_p;
          if (((*__s1 == '/') && (__s1[1] == 'F')) && (__s1[2] == 'e')) {
            std::__cxx11::string::substr((ulong)&local_80,(ulong)argBeg._M_current);
          }
          else {
            iVar3 = strncmp(__s1,"/out:",5);
            if (iVar3 != 0) goto LAB_00227bb8;
            std::__cxx11::string::substr((ulong)&local_80,(ulong)argBeg._M_current);
          }
          std::__cxx11::string::operator=(local_40,(string *)&local_80);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p != &local_80.field_2) {
            operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
          }
        }
      }
LAB_00227bb8:
      argBeg._M_current = argBeg._M_current + 1;
    } while (argBeg._M_current != argEnd._M_current);
    if ((this->TargetFile)._M_string_length == 0) {
LAB_00227ec5:
      bVar5 = false;
    }
    else {
      paVar1 = &local_80.field_2;
      local_80._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>((string *)&local_80,local_60,local_60 + local_58);
      std::__cxx11::string::append((char *)&local_80);
      std::__cxx11::string::operator=((string *)&this->ManifestFile,(string *)&local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != paVar1) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      local_80._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>((string *)&local_80,local_60,local_60 + local_58);
      std::__cxx11::string::append((char *)&local_80);
      __rhs = &this->LinkerManifestFile;
      std::__cxx11::string::operator=((string *)__rhs,(string *)&local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != paVar1) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      if (this->Incremental == true) {
        local_80._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>((string *)&local_80,local_60,local_60 + local_58);
        std::__cxx11::string::append((char *)&local_80);
        std::__cxx11::string::operator=((string *)&this->ManifestFileRC,(string *)&local_80);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != paVar1) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
        local_80._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>((string *)&local_80,local_60,local_60 + local_58);
        std::__cxx11::string::append((char *)&local_80);
        std::__cxx11::string::operator=((string *)&this->ManifestFileRes,(string *)&local_80);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != paVar1) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
      }
      else if ((this->UserManifests).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start ==
               (this->UserManifests).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish) {
        pcVar2 = (this->TargetFile)._M_dataplus._M_p;
        local_80._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_80,pcVar2,pcVar2 + (this->TargetFile)._M_string_length);
        std::__cxx11::string::append((char *)&local_80);
        std::__cxx11::string::operator=((string *)&this->ManifestFile,(string *)&local_80);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != paVar1) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::_M_assign((string *)__rhs);
      }
      bVar5 = true;
      if (this->LinkGeneratesManifest == true) {
        local_80._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"/MANIFEST","");
        this_00 = local_38;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>(local_38,&local_80);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != paVar1) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
        std::operator+(&local_80,"/MANIFESTFILE:",__rhs);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>(this_00,&local_80);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != paVar1) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
      }
    }
  }
  if (local_60 != &local_50) {
    operator_delete(local_60,CONCAT71(uStack_4f,local_50) + 1);
  }
  return bVar5;
}

Assistant:

bool cmVSLink::Parse(std::vector<std::string>::const_iterator argBeg,
                     std::vector<std::string>::const_iterator argEnd)
{
  // Parse our own arguments.
  std::string intDir;
  std::vector<std::string>::const_iterator arg = argBeg;
  while (arg != argEnd && cmHasLiteralPrefix(*arg, "-"))
    {
    if (*arg == "--")
      {
      ++arg;
      break;
      }
    else if (*arg == "--manifests")
      {
      for (++arg; arg != argEnd && !cmHasLiteralPrefix(*arg, "-"); ++arg)
        {
        this->UserManifests.push_back(*arg);
        }
      }
    else if (cmHasLiteralPrefix(*arg, "--intdir="))
      {
      intDir = arg->substr(9);
      ++arg;
      }
    else
      {
      std::cerr << "unknown argument '" << *arg << "'\n";
      return false;
      }
    }
  if (intDir.empty())
    {
    return false;
    }

  // The rest of the arguments form the link command.
  if (arg == argEnd)
    {
    return false;
    }
  this->LinkCommand.insert(this->LinkCommand.begin(), arg, argEnd);

  // Parse the link command to extract information we need.
  for (; arg != argEnd; ++arg)
    {
    if (cmSystemTools::Strucmp(arg->c_str(), "/INCREMENTAL:YES") == 0)
      {
      this->Incremental = true;
      }
    else if (cmSystemTools::Strucmp(arg->c_str(), "/INCREMENTAL") == 0)
      {
      this->Incremental = true;
      }
    else if (cmSystemTools::Strucmp(arg->c_str(), "/MANIFEST:NO") == 0)
      {
      this->LinkGeneratesManifest = false;
      }
    else if (cmHasLiteralPrefix(*arg, "/Fe"))
      {
      this->TargetFile = arg->substr(3);
      }
    else if (cmHasLiteralPrefix(*arg, "/out:"))
      {
      this->TargetFile = arg->substr(5);
      }
    }

  if (this->TargetFile.empty())
    {
    return false;
    }

  this->ManifestFile = intDir + "/embed.manifest";
  this->LinkerManifestFile = intDir + "/intermediate.manifest";

  if (this->Incremental)
    {
    // We will compile a resource containing the manifest and
    // pass it to the link command.
    this->ManifestFileRC = intDir + "/manifest.rc";
    this->ManifestFileRes = intDir + "/manifest.res";
    }
  else if (this->UserManifests.empty())
    {
    // Prior to support for user-specified manifests CMake placed the
    // linker-generated manifest next to the binary (as if it were not to be
    // embedded) when not linking incrementally.  Preserve this behavior.
    this->ManifestFile = this->TargetFile + ".manifest";
    this->LinkerManifestFile = this->ManifestFile;
    }

  if (this->LinkGeneratesManifest)
    {
    this->LinkCommand.push_back("/MANIFEST");
    this->LinkCommand.push_back("/MANIFESTFILE:" + this->LinkerManifestFile);
    }

  return true;
}